

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

void __thiscall
Catch::
BinaryExpr<const_std::chrono::time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_&,_const_hta::Clock::time_point_&>
::streamReconstructedExpression
          (BinaryExpr<const_std::chrono::time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_&,_const_hta::Clock::time_point_&>
           *this,ostream *os)

{
  string *lhs;
  char *pcVar1;
  time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_> *in_RDX;
  string *in_R9;
  StringRef op;
  long *local_60 [2];
  long local_50 [2];
  string local_40;
  
  StringMaker<std::chrono::time_point<hta::Clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>,void>
  ::convert_abi_cxx11_
            (&local_40,
             (StringMaker<std::chrono::time_point<hta::Clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>,void>
              *)this->m_lhs,in_RDX);
  lhs = (string *)(this->m_op).m_start;
  pcVar1 = (char *)(this->m_op).m_size;
  local_60[0] = local_50;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_60,Detail::unprintableString_abi_cxx11_,
             DAT_001b5eb0 + Detail::unprintableString_abi_cxx11_);
  op.m_size = (size_type)local_60;
  op.m_start = pcVar1;
  formatReconstructedExpression((Catch *)os,(ostream *)&local_40,lhs,op,in_R9);
  if (local_60[0] != local_50) {
    operator_delete(local_60[0],local_50[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void streamReconstructedExpression( std::ostream &os ) const override {
            formatReconstructedExpression
                    ( os, Catch::Detail::stringify( m_lhs ), m_op, Catch::Detail::stringify( m_rhs ) );
        }